

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_chasm_bin.cpp
# Opt level: O2

bool __thiscall FChasmBinFile::ReadNextEntry(FChasmBinFile *this,DWORD index)

{
  FileReader *pFVar1;
  DWORD *pDVar2;
  undefined4 uVar3;
  DWORD DVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  undefined4 extraout_var;
  MemoryLump *pMVar8;
  undefined4 extraout_var_00;
  char *pcVar9;
  undefined4 extraout_var_01;
  ChasmBinEntry *entry_00;
  ulong uVar10;
  ChasmBinEntry entry;
  undefined1 local_60 [24];
  DWORD DStack_48;
  DWORD DStack_44;
  DWORD DStack_40;
  DWORD DStack_3c;
  DWORD DStack_38;
  
  pFVar1 = (this->super_FResourceFile).Reader;
  iVar6 = (*(pFVar1->super_FileReaderBase)._vptr_FileReaderBase[2])(pFVar1,&entry,0x15);
  if (CONCAT44(extraout_var,iVar6) != 0x15) goto LAB_0057ece7;
  entry.name[0] = entry.name[1];
  entry.name._1_7_ = SUB87(CONCAT17(entry.name[8],entry.name._1_7_) >> 8,0);
  uVar3._3_1_ = entry.name[0xc];
  uVar3._0_1_ = entry.name[9];
  uVar3._1_1_ = entry.name[10];
  uVar3._2_1_ = entry.name[0xb];
  entry.name[0xc] = '\0';
  entry.name._8_4_ = uVar3;
  bVar5 = anon_unknown.dwarf_7f0cde::HasExtension(entry.name,"PCM");
  if (((bVar5) || (bVar5 = anon_unknown.dwarf_7f0cde::HasExtension(entry.name,"RAW"), bVar5)) ||
     (bVar5 = anon_unknown.dwarf_7f0cde::HasExtension(entry.name,"SFX"), bVar5)) {
    DVar4 = entry.size;
    uVar10 = (ulong)entry.size;
    pMVar8 = (MemoryLump *)operator_new(0x60);
    anon_unknown.dwarf_7f0cde::MemoryLump::MemoryLump(pMVar8,uVar10 + 0x2c);
    (pMVar8->super_FResourceLump).Namespace = 0xd;
    pcVar9 = pMVar8->m_buffer;
    pcVar9[0] = 'R';
    pcVar9[1] = 'I';
    pcVar9[2] = 'F';
    pcVar9[3] = 'F';
    *(DWORD *)(pcVar9 + 4) = DVar4 + 0x24;
    pcVar9[8] = 'W';
    pcVar9[9] = 'A';
    pcVar9[10] = 'V';
    pcVar9[0xb] = 'E';
    pcVar9[0xc] = 'f';
    pcVar9[0xd] = 'm';
    pcVar9[0xe] = 't';
    pcVar9[0xf] = ' ';
    pcVar9[0x10] = '\x10';
    pcVar9[0x11] = '\0';
    pcVar9[0x12] = '\0';
    pcVar9[0x13] = '\0';
    pcVar9[0x14] = '\x01';
    pcVar9[0x15] = '\0';
    pcVar9[0x16] = '\x01';
    pcVar9[0x17] = '\0';
    pcVar9[0x18] = '\x11';
    pcVar9[0x19] = '+';
    pcVar9[0x1a] = '\0';
    pcVar9[0x1b] = '\0';
    pcVar9[0x1c] = '\x11';
    pcVar9[0x1d] = '+';
    pcVar9[0x1e] = '\0';
    pcVar9[0x1f] = '\0';
    pcVar9[0x20] = '\x01';
    pcVar9[0x21] = '\0';
    pcVar9[0x22] = '\b';
    pcVar9[0x23] = '\0';
    pcVar9[0x24] = 'd';
    pcVar9[0x25] = 'a';
    pcVar9[0x26] = 't';
    pcVar9[0x27] = 'a';
    *(DWORD *)(pcVar9 + 0x28) = DVar4;
    iVar7 = (*(((this->super_FResourceFile).Reader)->super_FileReaderBase)._vptr_FileReaderBase[3])
                      ();
    pFVar1 = (this->super_FResourceFile).Reader;
    (*(pFVar1->super_FileReaderBase)._vptr_FileReaderBase[4])(pFVar1,(ulong)entry.offset,0);
    pFVar1 = (this->super_FResourceFile).Reader;
    (*(pFVar1->super_FileReaderBase)._vptr_FileReaderBase[2])
              (pFVar1,pcVar9 + 0x2c,(ulong)entry.size);
    pFVar1 = (this->super_FResourceFile).Reader;
    (*(pFVar1->super_FileReaderBase)._vptr_FileReaderBase[4])
              (pFVar1,CONCAT44(extraout_var_00,iVar7),0);
    AddEntryToSoundInfo(this,&entry);
LAB_0057ec9e:
    (pMVar8->super_FResourceLump).Owner = &this->super_FResourceFile;
    (pMVar8->super_FResourceLump).LumpSize = entry.size;
    local_60._0_8_ = pMVar8;
    pcVar9 = copystring(entry.name);
    FString::operator=(&(pMVar8->super_FResourceLump).FullName,pcVar9);
LAB_0057ecc5:
    anon_unknown.dwarf_7f0cde::CopyBaseName
              ((((FResourceLump *)local_60._0_8_)->field_3).Name,entry.name);
  }
  else {
    pcVar9 = "WAV";
    bVar5 = anon_unknown.dwarf_7f0cde::HasExtension(entry.name,"WAV");
    if (bVar5) {
      iVar7 = (*(((this->super_FResourceFile).Reader)->super_FileReaderBase)._vptr_FileReaderBase[3]
              )();
      pFVar1 = (this->super_FResourceFile).Reader;
      (*(pFVar1->super_FileReaderBase)._vptr_FileReaderBase[4])(pFVar1,(ulong)entry.offset,0);
      pFVar1 = (this->super_FResourceFile).Reader;
      entry_00 = (ChasmBinEntry *)local_60;
      (*(pFVar1->super_FileReaderBase)._vptr_FileReaderBase[2])(pFVar1,entry_00,0x2c);
      if (local_60._16_4_ == 0x10) {
        pMVar8 = (MemoryLump *)MakeUncompressedLump((FChasmBinFile *)&entry,entry_00);
      }
      else {
        local_60._16_4_ = 0x10;
        pMVar8 = (MemoryLump *)operator_new(0x60);
        anon_unknown.dwarf_7f0cde::MemoryLump::MemoryLump(pMVar8,(ulong)entry.size);
        pDVar2 = (DWORD *)pMVar8->m_buffer;
        pDVar2[7] = DStack_44;
        pDVar2[8] = DStack_40;
        pDVar2[9] = DStack_3c;
        pDVar2[10] = DStack_38;
        pDVar2[4] = local_60._16_4_;
        pDVar2[5] = local_60._20_4_;
        pDVar2[6] = DStack_48;
        pDVar2[7] = DStack_44;
        *pDVar2 = local_60._0_4_;
        pDVar2[1] = local_60._4_4_;
        pDVar2[2] = local_60._8_4_;
        pDVar2[3] = local_60._12_4_;
        pFVar1 = (this->super_FResourceFile).Reader;
        (*(pFVar1->super_FileReaderBase)._vptr_FileReaderBase[2])
                  (pFVar1,pDVar2 + 0xb,(ulong)entry.size - 0x2c);
      }
      (pMVar8->super_FResourceLump).Namespace = 0xd;
      AddEntryToSoundInfo(this,&entry);
      pFVar1 = (this->super_FResourceFile).Reader;
      (*(pFVar1->super_FileReaderBase)._vptr_FileReaderBase[4])
                (pFVar1,CONCAT44(extraout_var_01,iVar7),0);
      goto LAB_0057ec9e;
    }
    pMVar8 = (MemoryLump *)MakeUncompressedLump((FChasmBinFile *)&entry,(ChasmBinEntry *)pcVar9);
    local_60._0_8_ = pMVar8;
    bVar5 = anon_unknown.dwarf_7f0cde::HasExtension(entry.name,"CEL");
    (pMVar8->super_FResourceLump).Owner = &this->super_FResourceFile;
    (pMVar8->super_FResourceLump).LumpSize = entry.size;
    pcVar9 = copystring(entry.name);
    FString::operator=(&(pMVar8->super_FResourceLump).FullName,pcVar9);
    if (bVar5) goto LAB_0057ecc5;
  }
  TArray<FResourceLump_*,_FResourceLump_*>::Push(&this->m_lumps,(FResourceLump **)local_60);
LAB_0057ece7:
  return CONCAT44(extraout_var,iVar6) == 0x15;
}

Assistant:

bool FChasmBinFile::ReadNextEntry(const DWORD index)
{
	ChasmBinEntry entry;

	const long bytesRead = Reader->Read(&entry, long(sizeof entry));
	if (size_t(bytesRead) != sizeof entry)
	{
		return false;
	}

	// Convert Pascal string to zero-terminated
	memmove(entry.name, &entry.name[1], sizeof entry.name - 1);
	entry.name[sizeof entry.name - 1] = '\0';

	FResourceLump* lump = NULL;
	bool supportedFormat = false;

	if (   HasExtension(entry.name, "PCM")
		|| HasExtension(entry.name, "RAW")
		|| HasExtension(entry.name, "SFX"))
	{
		lump = MakeRawSoundLump(entry);
		supportedFormat = true;
	}
	else if (HasExtension(entry.name, "WAV"))
	{
		lump = MakeWaveSoundLump(entry);
		supportedFormat = true;
	}
	else
	{
		lump = MakeUncompressedLump(entry);
		supportedFormat = HasExtension(entry.name, "CEL");
	}

	// Set common lump parameters

	lump->Owner    = this;
	lump->LumpSize = LittleLong(entry.size);
	lump->FullName = copystring(entry.name);

	// TODO: namespace

	if (supportedFormat)
	{
		CopyBaseName(lump->Name, entry.name);
	}

	m_lumps.Push(lump);

	return true;
}